

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * anon_unknown.dwarf_1add5::reductionBarrettPrecomputation(BN *__return_storage_ptr__,BN *mod)

{
  size_type __n;
  vector<unsigned_short,_std::allocator<unsigned_short>_> ba;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> _Stack_68;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_50;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_38;
  
  __n = (long)(mod->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish +
        (1 - (long)(mod->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_38,__n,
             (allocator_type *)&_Stack_68);
  local_38._M_impl.super__Vector_impl_data._M_finish[-1] = 1;
  BN::BN((BN *)&local_50,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_38,__n);
  BN::operator/((BN *)&_Stack_68,(BN *)&local_50,mod);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&__return_storage_ptr__->ba,
             (vector<unsigned_short,_std::allocator<unsigned_short>_> *)&_Stack_68);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&_Stack_68);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_50);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

const BN reductionBarrettPrecomputation(const BN& mod) {
    size_t rbc = mod.digitCount() * 2 + 1;
    vector<bt> ba(rbc);
    ba.back() = 1;
    return move(BN(ba, rbc) / mod);
}